

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::GenerateMapEntry
          (Parser *this,MapField *map_field,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages)

{
  byte *pbVar1;
  uint uVar2;
  Type TVar3;
  long lVar4;
  long lVar5;
  MapField *pMVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  void *pvVar10;
  long *plVar11;
  void *pvVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *from;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar13;
  void *pvVar14;
  UninterpretedOption *pUVar15;
  Arena *pAVar16;
  int index;
  long lVar17;
  undefined1 *puVar18;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *pRVar19;
  string_view value;
  string_view value_00;
  string entry_name;
  string local_58;
  MapField *local_38;
  
  local_38 = map_field;
  pvVar10 = internal::RepeatedPtrFieldBase::AddMessageLite
                      (&messages->super_RepeatedPtrFieldBase,
                       Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  plVar11 = (long *)((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar4 = *plVar11;
  lVar5 = plVar11[1];
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_58);
  if (lVar5 != 0) {
    bVar8 = true;
    lVar17 = 0;
    do {
      bVar7 = true;
      if (*(char *)(lVar4 + lVar17) != '_') {
        if (bVar8) {
          std::__cxx11::string::push_back((char)&local_58);
          bVar7 = false;
        }
        else {
          std::__cxx11::string::push_back((char)&local_58);
          bVar7 = bVar8;
        }
      }
      bVar8 = bVar7;
      lVar17 = lVar17 + 1;
    } while (lVar5 != lVar17);
  }
  std::__cxx11::string::append((char *)&local_58);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
  pAVar16 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar16 & 1) != 0) {
    pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(field->field_0)._impl_.type_name_,&local_58,pAVar16);
  pMVar6 = local_38;
  *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 1;
  pAVar16 = *(Arena **)((long)pvVar10 + 8);
  if (((ulong)pAVar16 & 1) != 0) {
    pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)((long)pvVar10 + 0xd8),&local_58,pAVar16);
  *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 2;
  if (*(long *)((long)pvVar10 + 0xe0) == 0) {
    pAVar16 = *(Arena **)((long)pvVar10 + 8);
    if (((ulong)pAVar16 & 1) != 0) {
      pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
    }
    pvVar12 = Arena::DefaultConstruct<google::protobuf::MessageOptions>(pAVar16);
    *(void **)((long)pvVar10 + 0xe0) = pvVar12;
  }
  lVar4 = *(long *)((long)pvVar10 + 0xe0);
  *(undefined1 *)(lVar4 + 0x53) = 1;
  pbVar1 = (byte *)(lVar4 + 0x28);
  *pbVar1 = *pbVar1 | 0x10;
  pvVar12 = internal::RepeatedPtrFieldBase::AddMessageLite
                      ((RepeatedPtrFieldBase *)((long)pvVar10 + 0x18),
                       Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar12 + 0x10) = *(byte *)((long)pvVar12 + 0x10) | 1;
  pAVar16 = *(Arena **)((long)pvVar12 + 8);
  if (((ulong)pAVar16 & 1) != 0) {
    pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
  }
  value._M_str = "key";
  value._M_len = 3;
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar12 + 0x18),value,pAVar16);
  bVar8 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
  if (bVar8) {
    *(undefined4 *)((long)pvVar12 + 0x54) = 1;
    uVar2 = *(uint *)((long)pvVar12 + 0x10);
    *(undefined4 *)((long)pvVar12 + 0x48) = 1;
    *(uint *)((long)pvVar12 + 0x10) = uVar2 | 0x240;
    if ((pMVar6->key_type_name)._M_string_length == 0) {
      TVar3 = pMVar6->key_type;
      bVar8 = internal::ValidateEnum(TVar3,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
      if (!bVar8) goto LAB_001ff43c;
      *(Type *)((long)pvVar12 + 0x58) = TVar3;
      *(byte *)((long)pvVar12 + 0x11) = *(byte *)((long)pvVar12 + 0x11) | 4;
    }
    else {
      *(uint *)((long)pvVar12 + 0x10) = uVar2 | 0x244;
      pAVar16 = *(Arena **)((long)pvVar12 + 8);
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)((long)pvVar12 + 0x28),&pMVar6->key_type_name,pAVar16);
    }
    pvVar10 = internal::RepeatedPtrFieldBase::AddMessageLite
                        ((RepeatedPtrFieldBase *)((long)pvVar10 + 0x18),
                         Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
    *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 1;
    pAVar16 = *(Arena **)((long)pvVar10 + 8);
    if (((ulong)pAVar16 & 1) != 0) {
      pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
    }
    value_00._M_str = "value";
    value_00._M_len = 5;
    internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar10 + 0x18),value_00,pAVar16);
    bVar8 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
    if (bVar8) {
      *(undefined4 *)((long)pvVar10 + 0x54) = 1;
      uVar2 = *(uint *)((long)pvVar10 + 0x10);
      *(undefined4 *)((long)pvVar10 + 0x48) = 2;
      *(uint *)((long)pvVar10 + 0x10) = uVar2 | 0x240;
      if ((pMVar6->value_type_name)._M_string_length == 0) {
        TVar3 = pMVar6->value_type;
        bVar8 = internal::ValidateEnum(TVar3,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
        if (!bVar8) {
LAB_001ff43c:
          __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                        ,0x3a52,
                        "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                       );
        }
        *(Type *)((long)pvVar10 + 0x58) = TVar3;
        *(byte *)((long)pvVar10 + 0x11) = *(byte *)((long)pvVar10 + 0x11) | 4;
      }
      else {
        *(uint *)((long)pvVar10 + 0x10) = uVar2 | 0x244;
        pAVar16 = *(Arena **)((long)pvVar10 + 8);
        if (((ulong)pAVar16 & 1) != 0) {
          pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)((long)pvVar10 + 0x28),&pMVar6->value_type_name,pAVar16);
      }
      puVar18 = (undefined1 *)(field->field_0)._impl_.options_;
      if ((FieldOptions *)puVar18 == (FieldOptions *)0x0) {
        puVar18 = _FieldOptions_default_instance_;
      }
      if (0 < *(int *)((long)&((FieldOptions *)puVar18)->field_0 + 0x50)) {
        index = 0;
        do {
          from = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(((FieldOptions *)puVar18)->field_0)._impl_.uninterpreted_option_.
                             super_RepeatedPtrFieldBase,index);
          if (*(int *)((long)&from->field_0 + 0x10) == 1) {
            pRVar19 = &(from->field_0)._impl_.name_;
            pVVar13 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                (&pRVar19->super_RepeatedPtrFieldBase,0);
            iVar9 = std::__cxx11::string::compare
                              ((char *)((ulong)(pVVar13->field_0)._impl_.name_part_.tagged_ptr_.ptr_
                                       & 0xfffffffffffffffc));
            if ((iVar9 == 0) &&
               (pVVar13 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                    (&pRVar19->super_RepeatedPtrFieldBase,0),
               (pVVar13->field_0)._impl_.is_extension_ == false)) {
              if (*(int *)((long)pvVar12 + 0x58) == 9) {
                *(byte *)((long)pvVar12 + 0x10) = *(byte *)((long)pvVar12 + 0x10) | 0x20;
                if (*(long *)((long)pvVar12 + 0x40) == 0) {
                  pAVar16 = *(Arena **)((long)pvVar12 + 8);
                  if (((ulong)pAVar16 & 1) != 0) {
                    pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
                  }
                  pvVar14 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar16);
                  *(void **)((long)pvVar12 + 0x40) = pvVar14;
                }
                pUVar15 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddMessageLite
                                    ((RepeatedPtrFieldBase *)
                                     (*(long *)((long)pvVar12 + 0x40) + 0x58),
                                     Arena::DefaultConstruct<google::protobuf::UninterpretedOption>)
                ;
                UninterpretedOption::CopyFrom(pUVar15,from);
              }
              if (*(int *)((long)pvVar10 + 0x58) == 9) {
                *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 0x20;
                if (*(long *)((long)pvVar10 + 0x40) == 0) {
                  pAVar16 = *(Arena **)((long)pvVar10 + 8);
                  if (((ulong)pAVar16 & 1) != 0) {
                    pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
                  }
                  pvVar14 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar16);
                  *(void **)((long)pvVar10 + 0x40) = pvVar14;
                }
                pUVar15 = (UninterpretedOption *)
                          internal::RepeatedPtrFieldBase::AddMessageLite
                                    ((RepeatedPtrFieldBase *)
                                     (*(long *)((long)pvVar10 + 0x40) + 0x58),
                                     Arena::DefaultConstruct<google::protobuf::UninterpretedOption>)
                ;
                UninterpretedOption::CopyFrom(pUVar15,from);
              }
            }
          }
          pRVar19 = &(from->field_0)._impl_.name_;
          pVVar13 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                              (&pRVar19->super_RepeatedPtrFieldBase,0);
          iVar9 = std::__cxx11::string::compare
                            ((char *)((ulong)(pVVar13->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
          if ((iVar9 == 0) &&
             (pVVar13 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                  (&pRVar19->super_RepeatedPtrFieldBase,0),
             (pVVar13->field_0)._impl_.is_extension_ == false)) {
            *(byte *)((long)pvVar12 + 0x10) = *(byte *)((long)pvVar12 + 0x10) | 0x20;
            if (*(long *)((long)pvVar12 + 0x40) == 0) {
              pAVar16 = *(Arena **)((long)pvVar12 + 8);
              if (((ulong)pAVar16 & 1) != 0) {
                pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
              }
              pvVar14 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar16);
              *(void **)((long)pvVar12 + 0x40) = pvVar14;
            }
            pUVar15 = (UninterpretedOption *)
                      internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)(*(long *)((long)pvVar12 + 0x40) + 0x58),
                                 Arena::DefaultConstruct<google::protobuf::UninterpretedOption>);
            UninterpretedOption::CopyFrom(pUVar15,from);
            *(byte *)((long)pvVar10 + 0x10) = *(byte *)((long)pvVar10 + 0x10) | 0x20;
            if (*(long *)((long)pvVar10 + 0x40) == 0) {
              pAVar16 = *(Arena **)((long)pvVar10 + 8);
              if (((ulong)pAVar16 & 1) != 0) {
                pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
              }
              pvVar14 = Arena::DefaultConstruct<google::protobuf::FieldOptions>(pAVar16);
              *(void **)((long)pvVar10 + 0x40) = pvVar14;
            }
            pUVar15 = (UninterpretedOption *)
                      internal::RepeatedPtrFieldBase::AddMessageLite
                                ((RepeatedPtrFieldBase *)(*(long *)((long)pvVar10 + 0x40) + 0x58),
                                 Arena::DefaultConstruct<google::protobuf::UninterpretedOption>);
            UninterpretedOption::CopyFrom(pUVar15,from);
          }
          puVar18 = (undefined1 *)(field->field_0)._impl_.options_;
          if ((FieldOptions *)puVar18 == (FieldOptions *)0x0) {
            puVar18 = _FieldOptions_default_instance_;
          }
          index = index + 1;
        } while (index < *(int *)((long)&((FieldOptions *)puVar18)->field_0 + 0x50));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                ,0x3a33,
                "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
               );
}

Assistant:

void Parser::GenerateMapEntry(const MapField& map_field,
                              FieldDescriptorProto* field,
                              RepeatedPtrField<DescriptorProto>* messages) {
  DescriptorProto* entry = messages->Add();
  std::string entry_name = MapEntryName(field->name());
  field->set_type_name(entry_name);
  entry->set_name(entry_name);
  entry->mutable_options()->set_map_entry(true);
  FieldDescriptorProto* key_field = entry->add_field();
  key_field->set_name("key");
  key_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  key_field->set_number(1);
  if (map_field.key_type_name.empty()) {
    key_field->set_type(map_field.key_type);
  } else {
    key_field->set_type_name(map_field.key_type_name);
  }
  FieldDescriptorProto* value_field = entry->add_field();
  value_field->set_name("value");
  value_field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
  value_field->set_number(2);
  if (map_field.value_type_name.empty()) {
    value_field->set_type(map_field.value_type);
  } else {
    value_field->set_type_name(map_field.value_type_name);
  }
  // Propagate all features to the generated key and value fields. This helps
  // simplify the implementation of code generators and also reflection-based
  // parsing code. Instead of having to implement complex inheritance rules
  // special-casing maps, we can just copy them at generation time.
  //
  // The following definition:
  //   message Foo {
  //     map<string, string> value = 1 [features.some_feature = VALUE];
  //   }
  // will be interpreted as:
  //   message Foo {
  //     message ValueEntry {
  //       option map_entry = true;
  //       string key = 1 [features.some_feature = VALUE];
  //       string value = 2 [features.some_feature = VALUE];
  //     }
  //     repeated ValueEntry value = 1 [features.some_feature = VALUE];
  //  }
  for (int i = 0; i < field->options().uninterpreted_option_size(); ++i) {
    const UninterpretedOption& option =
        field->options().uninterpreted_option(i);
    // Legacy handling for the `enforce_utf8` option, which bears a striking
    // similarity to features in many respects.
    // TODO Delete this once proto2/proto3 have been turned down.
    if (option.name_size() == 1 &&
        option.name(0).name_part() == "enforce_utf8" &&
        !option.name(0).is_extension()) {
      if (key_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *key_field->mutable_options()->add_uninterpreted_option() = option;
      }
      if (value_field->type() == FieldDescriptorProto::TYPE_STRING) {
        *value_field->mutable_options()->add_uninterpreted_option() = option;
      }
    }
    if (option.name(0).name_part() == "features" &&
        !option.name(0).is_extension()) {
      *key_field->mutable_options()->add_uninterpreted_option() = option;
      *value_field->mutable_options()->add_uninterpreted_option() = option;
    }
  }
}